

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint32_t helper_neon_rshl_s32_arm(uint32_t valop,uint32_t shiftop)

{
  byte bVar1;
  int32_t val;
  uint32_t uVar2;
  
  bVar1 = (byte)shiftop;
  uVar2 = 0;
  if (0xffffffc0 < (int)(char)bVar1 - 0x20U) {
    if ((char)bVar1 < '\0') {
      return (uint32_t)((1L << (~bVar1 & 0x3f)) + (long)(int)valop >> (-bVar1 & 0x3f));
    }
    uVar2 = valop << (bVar1 & 0x1f);
  }
  return uVar2;
}

Assistant:

uint32_t HELPER(neon_rshl_s32)(uint32_t valop, uint32_t shiftop)
{
    int32_t dest;
    int32_t val = (int32_t)valop;
    int8_t shift = (int8_t)shiftop;
    if ((shift >= 32) || (shift <= -32)) {
        dest = 0;
    } else if (shift < 0) {
        int64_t big_dest = ((int64_t)val + (1ULL << (-1 - shift)));
        dest = big_dest >> -shift;
    } else {
        dest = val << shift;
    }
    return dest;
}